

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsValue.c
# Opt level: O1

void JsToNumber(JsValue *val,JsValue *res)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 local_30 [8];
  char *pEnd;
  
  res->type = JS_NUMBER;
  switch(val->type) {
  case JS_UNDEFINED:
    (res->u).number = NAN;
    break;
  case JS_NULL:
    (res->u).number = 0.0;
    break;
  case JS_BOOLEAN:
    uVar2 = 0;
    uVar3 = 0;
    if ((val->u).boolean != 0) {
      uVar2 = 0;
      uVar3 = 0x3ff00000;
    }
    goto LAB_0011205a;
  case JS_NUMBER:
    (res->u).reference.name = (val->u).reference.name;
    uVar2 = *(undefined4 *)&val->field_0x4;
    dVar1 = (val->u).number;
    res->type = val->type;
    *(undefined4 *)&res->field_0x4 = uVar2;
    (res->u).number = dVar1;
    break;
  case JS_STRING:
    dVar1 = strtod((val->u).string,(char **)local_30);
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
    if (*(char *)local_30 != '\0') {
      uVar2 = 0;
      uVar3 = 0x7ff80000;
    }
LAB_0011205a:
    (res->u).object = (JsObject *)CONCAT44(uVar3,uVar2);
    break;
  case JS_OBJECT:
    JsToPrimitive(val,1,(JsValue *)local_30);
    JsToNumber((JsValue *)local_30,res);
    break;
  default:
    JsThrowString("JsToNumbeError");
    return;
  }
  return;
}

Assistant:

void JsToNumber(struct JsValue *val, struct JsValue *res){
	
	res->type = JS_NUMBER;
	switch (val->type) {
	case JS_UNDEFINED:
		res->u.number =  JS_VALUE_NUMBER_NAN;
		break;
	case JS_NULL:
		res->u.number = 0.0;
		break;
	case JS_BOOLEAN:
		res->u.number =  (val->u.boolean ? 1.0 : 0.0);
		break;
	case JS_NUMBER:
		*res = *val;
		break;
	case JS_STRING:{
			char * szOrbits, *pEnd;
			double d1;
			szOrbits = val->u.string;
			d1 = strtod (szOrbits,&pEnd);

			if(*pEnd == '\0'){
				res->u.number = d1;
			}else{
				//如果不是字符串末尾, 则表示没有解析完该字符串
				res->u.number = JS_VALUE_NUMBER_NAN;
			}
			break;
	    }
	case JS_OBJECT:{
			struct JsValue  primitive;
			JsToPrimitive(val,JS_OBJECT_HIT_TYPE_NUMBER,&primitive);
			JsToNumber(&primitive, res);
			break;
	    }
	default:
		JsThrowString("JsToNumbeError");
	}

}